

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

double3 * tinyusdz::vcross(double3 *__return_storage_ptr__,double3 *a,double3 *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  const_reference pvVar5;
  reference pvVar6;
  double3 *n;
  double3 *b_local;
  double3 *a_local;
  
  pvVar5 = ::std::array<double,_3UL>::operator[](a,1);
  dVar1 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](b,2);
  dVar2 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](a,2);
  dVar3 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](b,1);
  dVar4 = *pvVar5;
  pvVar6 = ::std::array<double,_3UL>::operator[](__return_storage_ptr__,0);
  *pvVar6 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pvVar5 = ::std::array<double,_3UL>::operator[](a,2);
  dVar1 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](b,0);
  dVar2 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](a,0);
  dVar3 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](b,2);
  dVar4 = *pvVar5;
  pvVar6 = ::std::array<double,_3UL>::operator[](__return_storage_ptr__,1);
  *pvVar6 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pvVar5 = ::std::array<double,_3UL>::operator[](a,0);
  dVar1 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](b,1);
  dVar2 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](a,1);
  dVar3 = *pvVar5;
  pvVar5 = ::std::array<double,_3UL>::operator[](b,0);
  dVar4 = *pvVar5;
  pvVar6 = ::std::array<double,_3UL>::operator[](__return_storage_ptr__,2);
  *pvVar6 = dVar1 * dVar2 + -(dVar3 * dVar4);
  return __return_storage_ptr__;
}

Assistant:

value::double3 vcross(const value::double3 &a, const value::double3 &b)
{
  value::double3 n;
  n[0] = a[1] * b[2] - a[2] * b[1];
  n[1] = a[2] * b[0] - a[0] * b[2];
  n[2] = a[0] * b[1] - a[1] * b[0];

  return n;
}